

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

int VP8ExitCritical(VP8Decoder *dec,VP8Io *io)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  
  if (dec->mt_method_ < 1) {
    iVar1 = 1;
  }
  else {
    pWVar2 = WebPGetWorkerInterface();
    iVar1 = (*pWVar2->Sync)(&dec->worker_);
  }
  if (io->teardown != (VP8IoTeardownHook)0x0) {
    (*io->teardown)(io);
  }
  return iVar1;
}

Assistant:

int VP8ExitCritical(VP8Decoder* const dec, VP8Io* const io) {
  int ok = 1;
  if (dec->mt_method_ > 0) {
    ok = WebPGetWorkerInterface()->Sync(&dec->worker_);
  }

  if (io->teardown != NULL) {
    io->teardown(io);
  }
  return ok;
}